

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O0

S2CellUnion * __thiscall
S2CellUnion::Difference(S2CellUnion *__return_storage_ptr__,S2CellUnion *this,S2CellUnion *y)

{
  bool bVar1;
  reference pSVar2;
  ostream *poVar3;
  byte local_aa;
  S2LogMessage local_78;
  S2LogMessageVoidify local_61;
  uint64 local_60;
  uint64 local_58;
  S2CellId id;
  const_iterator __end1;
  __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> local_38;
  const_iterator __begin1;
  S2CellUnion *__range1;
  S2CellUnion *y_local;
  S2CellUnion *this_local;
  S2CellUnion *result;
  
  S2CellUnion(__return_storage_ptr__);
  __begin1._M_current = (S2CellId *)this;
  local_38._M_current = (S2CellId *)begin(this);
  id.id_ = (uint64)end((S2CellUnion *)__begin1._M_current);
  while (bVar1 = __gnu_cxx::operator!=
                           (&local_38,
                            (__normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                             *)&id), bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
             ::operator*(&local_38);
    local_60 = pSVar2->id_;
    local_58 = local_60;
    GetDifferenceInternal((S2CellId)local_60,y,&__return_storage_ptr__->cell_ids_);
    __gnu_cxx::
    __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
    operator++(&local_38);
  }
  bVar1 = IsNormalized(__return_storage_ptr__);
  local_aa = 1;
  if (!bVar1) {
    bVar1 = IsNormalized(this);
    local_aa = bVar1 ^ 0xff;
  }
  if (((local_aa ^ 0xff) & 1) == 0) {
    return __return_storage_ptr__;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_union.cc"
             ,400,kFatal,(ostream *)&std::cerr);
  poVar3 = S2LogMessage::stream(&local_78);
  poVar3 = std::operator<<(poVar3,"Check failed: result.IsNormalized() || !IsNormalized() ");
  S2LogMessageVoidify::operator&(&local_61,poVar3);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_78);
}

Assistant:

S2CellUnion S2CellUnion::Difference(const S2CellUnion& y) const {
  // TODO(ericv): this is approximately O(N*log(N)), but could probably
  // use similar techniques as GetIntersection() to be more efficient.

  S2CellUnion result;
  for (S2CellId id : *this) {
    GetDifferenceInternal(id, y, &result.cell_ids_);
  }
  // The output is normalized as long as the first argument is normalized.
  S2_DCHECK(result.IsNormalized() || !IsNormalized());
  return result;
}